

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::shader_requires_feature(Converter *this,ShaderFeature feature)

{
  bool bVar1;
  bool bVar2;
  Builder *pBVar3;
  
  if (feature == Native16BitOperations) {
    pBVar3 = Impl::builder((this->impl)._M_t.
                           super___uniq_ptr_impl<dxil_spv::Converter::Impl,_std::default_delete<dxil_spv::Converter::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_dxil_spv::Converter::Impl_*,_std::default_delete<dxil_spv::Converter::Impl>_>
                           .super__Head_base<0UL,_dxil_spv::Converter::Impl_*,_false>._M_head_impl);
    bVar2 = spv::Builder::hasCapability(pBVar3,CapabilityFloat16);
    bVar1 = true;
    if (!bVar2) {
      pBVar3 = Impl::builder((this->impl)._M_t.
                             super___uniq_ptr_impl<dxil_spv::Converter::Impl,_std::default_delete<dxil_spv::Converter::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_dxil_spv::Converter::Impl_*,_std::default_delete<dxil_spv::Converter::Impl>_>
                             .super__Head_base<0UL,_dxil_spv::Converter::Impl_*,_false>._M_head_impl
                            );
      bVar2 = spv::Builder::hasCapability(pBVar3,CapabilityInt16);
      return bVar2;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Converter::shader_requires_feature(ShaderFeature feature) const
{
	switch (feature)
	{
	case ShaderFeature::Native16BitOperations:
		return impl->builder().hasCapability(spv::CapabilityFloat16) ||
		       impl->builder().hasCapability(spv::CapabilityInt16);

	default:
		return false;
	}
}